

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapS.c
# Opt level: O1

void Fxu_HeapSingleInsert(Fxu_HeapSingle *p,Fxu_Single *pSingle)

{
  int iVar1;
  Fxu_Single **ppFVar2;
  int iVar3;
  size_t __size;
  
  iVar1 = p->nItemsAlloc;
  if (p->nItems == iVar1) {
    p->nItemsAlloc = iVar1 * 2;
    __size = (long)iVar1 * 0x10 + 0x50;
    if (p->pTree == (Fxu_Single **)0x0) {
      ppFVar2 = (Fxu_Single **)malloc(__size);
    }
    else {
      ppFVar2 = (Fxu_Single **)realloc(p->pTree,__size);
    }
    p->pTree = ppFVar2;
  }
  iVar1 = p->nItems;
  iVar3 = iVar1 + 1;
  p->nItems = iVar3;
  p->pTree[(long)iVar1 + 1] = pSingle;
  pSingle->HNum = iVar3;
  Fxu_HeapSingleMoveUp(p,pSingle);
  return;
}

Assistant:

void Fxu_HeapSingleInsert( Fxu_HeapSingle * p, Fxu_Single * pSingle )
{
	if ( p->nItems == p->nItemsAlloc )
		Fxu_HeapSingleResize( p );
	// put the last entry to the last place and move up
	p->pTree[++p->nItems] = pSingle;
	pSingle->HNum = p->nItems;
	// move the last entry up if necessary
	Fxu_HeapSingleMoveUp( p, pSingle );
}